

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O0

bool tao::pegtl::internal::
     duseltronik<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::empty_line,tao::pegtl::ascii::eol>>,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)2,ovf::detail::parse::ovf_file_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)1>
     ::
     match<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>,ovf_file&>
               (file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *in,
               ovf_file *st)

{
  bool bVar1;
  ovf_file *st_local;
  file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *in_local;
  
  normal<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::empty_line,tao::pegtl::ascii::eol>>>::
  start<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>,ovf_file&>
            (in,st);
  bVar1 = duseltronik<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::empty_line,tao::pegtl::ascii::eol>>,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)2,ovf::detail::parse::ovf_file_action,tao::pegtl::normal,(tao::pegtl::internal::dusel_mode)0>
          ::
          match<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>,ovf_file&>
                    (in,st);
  if (bVar1) {
    normal<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::empty_line,tao::pegtl::ascii::eol>>>
    ::
    success<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>,ovf_file&>
              (in,st);
  }
  else {
    normal<tao::pegtl::star<tao::pegtl::seq<ovf::detail::parse::empty_line,tao::pegtl::ascii::eol>>>
    ::
    failure<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>,ovf_file&>
              (in,st);
  }
  return bVar1;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, M, Action, Control, dusel_mode::nothing >::match( in, st... ) ) {
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return true;
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }